

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

State __thiscall QAccessibleTableCell::state(QAccessibleTableCell *this)

{
  QPersistentModelIndex *this_00;
  Data *pDVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  SelectionMode SVar6;
  SelectionMode SVar7;
  QPoint QVar8;
  QModelIndex *pQVar9;
  ulong uVar10;
  QAbstractItemView *this_01;
  QAbstractItemModel *pQVar11;
  uint uVar12;
  State SVar13;
  QObject *object;
  uint uVar14;
  State SVar15;
  State SVar16;
  long in_FS_OFFSET;
  QRect QVar17;
  QModelIndex local_80;
  undefined1 local_68 [12];
  Representation RStack_5c;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = (**(code **)(*(long *)this + 0x10))();
  if (cVar2 == '\0') {
    SVar13 = (State)0x0;
  }
  else {
    stack0xffffffffffffffa0 = &DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QVar17 = QWidget::rect((QWidget *)(this->view).wp.value);
    local_58.shared = (PrivateShared *)0x0;
    _local_68 = QVar17;
    QVar8 = QWidget::mapToGlobal((QWidget *)(this->view).wp.value,(QPoint *)&local_58.shared);
    local_68._4_4_ = QVar17.y1.m_i.m_i + QVar8.yp.m_i.m_i;
    local_68._0_4_ = QVar8.xp.m_i.m_i + QVar17.x1.m_i.m_i;
    local_68._8_4_ = QVar17.x2.m_i.m_i + QVar8.xp.m_i.m_i;
    RStack_5c.m_i = QVar17.y2.m_i.m_i + QVar8.yp.m_i.m_i;
    local_58._0_16_ = (**(code **)(*(long *)this + 0x70))(this);
    bVar3 = QRect::intersects((QRect *)local_68);
    uVar12 = (uint)(bVar3 ^ 1) * 0x20000;
    pQVar9 = (QModelIndex *)
             QAbstractItemView::selectionModel((QAbstractItemView *)(this->view).wp.value);
    this_00 = &this->m_index;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
    cVar2 = QItemSelectionModel::isSelected(pQVar9);
    uVar14 = uVar12 + 2;
    if (cVar2 == '\0') {
      uVar14 = uVar12;
    }
    QAbstractItemView::selectionModel((QAbstractItemView *)(this->view).wp.value);
    QItemSelectionModel::currentIndex();
    cVar2 = ::comparesEqual(this_00,(QModelIndex *)&local_58);
    uVar12 = uVar14 + 8;
    if (cVar2 == '\0') {
      uVar12 = uVar14;
    }
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPersistentModelIndex::data((int)&local_58);
    iVar5 = ::QVariant::toInt((bool *)local_58.data);
    uVar14 = uVar12 + 0x40;
    if (iVar5 != 2) {
      uVar14 = uVar12;
    }
    SVar15._4_4_ = 0;
    SVar15._0_4_ = uVar14;
    uVar10 = QPersistentModelIndex::flags();
    SVar13._0_4_ = uVar14 | 0x20;
    SVar13._4_4_ = 0;
    if (puStack_40 < (undefined1 *)0x4) {
      SVar13 = SVar15;
    }
    if ((uVar10 & 0x10) == 0) {
      SVar13 = SVar15;
    }
    if ((uVar10 & 1) != 0) {
      SVar6 = QAbstractItemView::selectionMode((QAbstractItemView *)(this->view).wp.value);
      SVar7 = QAbstractItemView::selectionMode((QAbstractItemView *)(this->view).wp.value);
      uVar12 = SVar13._0_4_;
      SVar13._4_4_ = 0;
      SVar13._0_4_ = (uint)(SVar7 == ExtendedSelection) << 0x1a |
                     (uint)(SVar6 == MultiSelection) << 0x19 | uVar12 | 0x400004;
    }
    if (this->m_role == TreeItem) {
      pDVar1 = (this->view).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        object = (QObject *)0x0;
      }
      else {
        object = (this->view).wp.value;
      }
      this_01 = (QAbstractItemView *)
                QtPrivate::qobject_cast_helper<QTreeView_const*,QObject>(object);
      pQVar11 = QAbstractItemView::model(this_01);
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,this_00);
      cVar2 = (**(code **)(*(long *)pQVar11 + 0x88))(pQVar11,&local_80);
      SVar16._0_4_ = SVar13._0_4_ | 0x4000;
      SVar16._4_4_ = 0;
      if (cVar2 == '\0') {
        SVar16 = SVar13;
      }
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_80,this_00);
      bVar4 = QTreeView::isExpanded((QTreeView *)this_01,&local_80);
      SVar13._0_4_ = SVar16._0_4_ | 0x800;
      SVar13._4_4_ = 0;
      if (!bVar4) {
        SVar13 = SVar16;
      }
    }
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return SVar13;
  }
  __stack_chk_fail();
}

Assistant:

QAccessible::State QAccessibleTableCell::state() const
{
    QAccessible::State st;
    if (!isValid())
        return st;

    QRect globalRect = view->rect();
    globalRect.translate(view->mapToGlobal(QPoint(0,0)));
    if (!globalRect.intersects(rect()))
        st.invisible = true;

    if (view->selectionModel()->isSelected(m_index))
        st.selected = true;
    if (view->selectionModel()->currentIndex() == m_index)
        st.focused = true;

    const QVariant checkState = m_index.data(Qt::CheckStateRole);
    if (checkState.toInt() == Qt::Checked)
        st.checked = true;

    Qt::ItemFlags flags = m_index.flags();
    if ((flags & Qt::ItemIsUserCheckable) && checkState.isValid())
        st.checkable = true;
    if (flags & Qt::ItemIsSelectable) {
        st.selectable = true;
        st.focusable = true;
        if (view->selectionMode() == QAbstractItemView::MultiSelection)
            st.multiSelectable = true;
        if (view->selectionMode() == QAbstractItemView::ExtendedSelection)
            st.extSelectable = true;
    }
#if QT_CONFIG(treeview)
    if (m_role == QAccessible::TreeItem) {
        const QTreeView *treeView = qobject_cast<const QTreeView*>(view);
        if (treeView->model()->hasChildren(m_index))
            st.expandable = true;
        if (treeView->isExpanded(m_index))
            st.expanded = true;
    }
#endif
    return st;
}